

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_Page.cc
# Opt level: O0

void __thiscall MyDB_PageBase::reduceCount(MyDB_PageBase *this)

{
  value_type local_20;
  value_type local_18;
  MyDB_PageBase *local_10;
  MyDB_PageBase *this_local;
  
  this->handleCount = this->handleCount + -1;
  if (this->handleCount == 0) {
    if (this->slotId == -1) {
      this->isPined = false;
    }
    else {
      this->isPined = false;
      local_10 = this;
      if (this->addr == (void *)0x0) {
        local_20 = (value_type)this->slotId;
        std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  (&this->bufferManager->slotQueue,&local_20);
      }
      else {
        std::queue<void_*,_std::deque<void_*,_std::allocator<void_*>_>_>::push
                  (&this->bufferManager->availPageQueue,&this->addr);
        local_18 = (value_type)this->slotId;
        std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  (&this->bufferManager->slotQueue,&local_18);
      }
    }
  }
  return;
}

Assistant:

void MyDB_PageBase:: reduceCount() {

    this -> handleCount--;
    // if count turn to 0, decided if recycle
    if (handleCount == 0) {
        // if this page is a normal page
        if (slotId == -1) {
            // set the normal page unpined no matter if it is in the buffer
            this -> isPined = false;
        }
        // this page is anonymous
        else {
            this -> isPined = false;
            // if this page is in the buffer
            if (this -> addr != nullptr) {
                this -> bufferManager -> availPageQueue.push(this -> addr);
                this -> bufferManager -> slotQueue.push(this -> slotId);
            }
            // if this page is not in the buffer
            else {
                this -> bufferManager -> slotQueue.push(this -> slotId);
            }
            //delete this;
        }
    }
}